

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathNotEqualValues(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr *ppxVar1;
  xmlXPathObjectType *pxVar2;
  uint uVar3;
  xmlXPathObjectType xVar4;
  int iVar5;
  xmlXPathObjectPtr pxVar6;
  uint uVar7;
  xmlXPathObjectPtr arg2;
  xmlXPathContextPtr ctxt_00;
  xmlXPathObjectPtr arg2_00;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return 0;
  }
  if (ctxt->context == (xmlXPathContextPtr)0x0) {
    return 0;
  }
  iVar5 = ctxt->valueNr;
  if ((long)iVar5 < 1) {
    arg2 = (xmlXPathObjectPtr)0x0;
LAB_001bcf9d:
    ctxt_00 = ctxt->context;
  }
  else {
    uVar3 = iVar5 - 1;
    ctxt->valueNr = uVar3;
    ppxVar1 = ctxt->valueTab;
    if (iVar5 == 1) {
      ctxt->value = (xmlXPathObjectPtr)0x0;
      arg2 = ppxVar1[uVar3];
      ppxVar1[uVar3] = (xmlXPathObjectPtr)0x0;
      goto LAB_001bcf9d;
    }
    ctxt->value = ppxVar1[(long)iVar5 + -2];
    arg2 = ppxVar1[uVar3];
    ppxVar1[uVar3] = (xmlXPathObjectPtr)0x0;
    uVar7 = iVar5 - 2;
    ctxt->valueNr = uVar7;
    ppxVar1 = ctxt->valueTab;
    if (uVar3 == 1) {
      pxVar6 = (xmlXPathObjectPtr)0x0;
    }
    else {
      pxVar6 = ppxVar1[(ulong)uVar3 - 2];
    }
    ctxt->value = pxVar6;
    pxVar6 = ppxVar1[uVar7];
    ppxVar1[uVar7] = (xmlXPathObjectPtr)0x0;
    if ((pxVar6 != (xmlXPathObjectPtr)0x0) && (arg2 != (xmlXPathObjectPtr)0x0)) {
      if (pxVar6 == arg2) {
        xmlXPathReleaseObject(ctxt->context,pxVar6);
        return 0;
      }
      pxVar2 = &arg2->type;
      if ((*pxVar2 | XPATH_USERS) == XPATH_XSLT_TREE) {
        xVar4 = pxVar6->type;
      }
      else {
        xVar4 = pxVar6->type;
        if ((xVar4 | XPATH_USERS) != XPATH_XSLT_TREE) {
          iVar5 = xmlXPathEqualValuesCommon(ctxt,pxVar6,arg2);
          return (uint)(iVar5 == 0);
        }
      }
      arg2_00 = pxVar6;
      if ((xVar4 | XPATH_USERS) == XPATH_XSLT_TREE) {
        arg2_00 = arg2;
        arg2 = pxVar6;
        xVar4 = *pxVar2;
      }
      uVar3 = 0;
      switch(xVar4) {
      case XPATH_NODESET:
      case XPATH_XSLT_TREE:
        uVar3 = xmlXPathEqualNodeSets(ctxt,arg2,arg2_00,1);
        break;
      case XPATH_BOOLEAN:
        uVar3 = 0;
        if (arg2->nodesetval != (xmlNodeSetPtr)0x0) {
          uVar3 = (uint)(arg2->nodesetval->nodeNr != 0);
        }
        uVar3 = (uint)(uVar3 != arg2_00->boolval);
        break;
      case XPATH_NUMBER:
        uVar3 = xmlXPathEqualNodeSetFloat(ctxt,arg2,arg2_00->floatval,1);
        break;
      case XPATH_STRING:
        uVar3 = xmlXPathEqualNodeSetString(ctxt,arg2,arg2_00->stringval,1);
      }
      xmlXPathReleaseObject(ctxt->context,arg2);
      xmlXPathReleaseObject(ctxt->context,arg2_00);
      return uVar3;
    }
    ctxt_00 = ctxt->context;
    if (pxVar6 != (xmlXPathObjectPtr)0x0) goto LAB_001bcfa4;
  }
  pxVar6 = arg2;
LAB_001bcfa4:
  xmlXPathReleaseObject(ctxt_00,pxVar6);
  xmlXPathErr(ctxt,10);
  return 0;
}

Assistant:

int
xmlXPathNotEqualValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg1, arg2, argtmp;
    int ret = 0;

    if ((ctxt == NULL) || (ctxt->context == NULL)) return(0);
    arg2 = xmlXPathValuePop(ctxt);
    arg1 = xmlXPathValuePop(ctxt);
    if ((arg1 == NULL) || (arg2 == NULL)) {
	if (arg1 != NULL)
	    xmlXPathReleaseObject(ctxt->context, arg1);
	else
	    xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }

    if (arg1 == arg2) {
	xmlXPathReleaseObject(ctxt->context, arg1);
        return(0);
    }

    /*
     *If either argument is a nodeset, it's a 'special case'
     */
    if ((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE) ||
      (arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
	/*
	 *Hack it to assure arg1 is the nodeset
	 */
	if ((arg1->type != XPATH_NODESET) && (arg1->type != XPATH_XSLT_TREE)) {
		argtmp = arg2;
		arg2 = arg1;
		arg1 = argtmp;
	}
	switch (arg2->type) {
	    case XPATH_UNDEFINED:
		break;
	    case XPATH_NODESET:
	    case XPATH_XSLT_TREE:
		ret = xmlXPathEqualNodeSets(ctxt, arg1, arg2, 1);
		break;
	    case XPATH_BOOLEAN:
		if ((arg1->nodesetval == NULL) ||
		  (arg1->nodesetval->nodeNr == 0)) ret = 0;
		else
		    ret = 1;
		ret = (ret != arg2->boolval);
		break;
	    case XPATH_NUMBER:
		ret = xmlXPathEqualNodeSetFloat(ctxt, arg1, arg2->floatval, 1);
		break;
	    case XPATH_STRING:
		ret = xmlXPathEqualNodeSetString(ctxt, arg1,
                                                 arg2->stringval, 1);
		break;
	    case XPATH_USERS:
		/* TODO */
		break;
	}
	xmlXPathReleaseObject(ctxt->context, arg1);
	xmlXPathReleaseObject(ctxt->context, arg2);
	return(ret);
    }

    return (!xmlXPathEqualValuesCommon(ctxt, arg1, arg2));
}